

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O3

OPJ_BOOL opj_start_compress(opj_codec_t *p_codec,opj_image_t *p_image,opj_stream_t *p_stream)

{
  OPJ_BOOL OVar1;
  
  if ((p_stream != (opj_stream_t *)0x0 && p_codec != (opj_codec_t *)0x0) &&
     (*(int *)(p_codec + 0x12) == 0)) {
    OVar1 = (*(code *)*p_codec)(p_codec[0xb],p_stream,p_image,p_codec + 0xc,*p_codec);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_start_compress(opj_codec_t *p_codec,
        opj_image_t * p_image,
        opj_stream_t *p_stream)
{
    if (p_codec && p_stream) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;
        opj_stream_private_t * l_stream = (opj_stream_private_t *) p_stream;

        if (! l_codec->is_decompressor) {
            return l_codec->m_codec_data.m_compression.opj_start_compress(l_codec->m_codec,
                    l_stream,
                    p_image,
                    &(l_codec->m_event_mgr));
        }
    }

    return OPJ_FALSE;
}